

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlBuildQName(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *pxVar3;
  int local_4c;
  int local_48;
  int n_len;
  int len;
  int n_memory;
  xmlChar *memory;
  int n_prefix;
  xmlChar *prefix;
  int n_ncname;
  xmlChar *ncname;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (prefix._4_4_ = 0; (int)prefix._4_4_ < 5; prefix._4_4_ = prefix._4_4_ + 1) {
    for (memory._4_4_ = 0; (int)memory._4_4_ < 5; memory._4_4_ = memory._4_4_ + 1) {
      for (n_len = 0; n_len < 2; n_len = n_len + 1) {
        for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_const_xmlChar_ptr(prefix._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(memory._4_4_,1);
          val_01 = gen_xmlChar_ptr(n_len,2);
          local_48 = gen_int(local_4c,3);
          if (val_00 != (xmlChar *)0x0) {
            iVar2 = xmlStrlen(val_00);
            if (iVar2 < local_48) {
              local_48 = 0;
            }
          }
          pxVar3 = (xmlChar *)xmlBuildQName(val,val_00,val_01,local_48);
          if ((((pxVar3 != (xmlChar *)0x0) && (pxVar3 != val)) && (pxVar3 != val_00)) &&
             (pxVar3 != val_01)) {
            (*_xmlFree)(pxVar3);
          }
          desret_xmlChar_ptr((xmlChar *)0x0);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(prefix._4_4_,val,0);
          des_const_xmlChar_ptr(memory._4_4_,val_00,1);
          des_xmlChar_ptr(n_len,val_01,2);
          des_int(local_4c,local_48,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)prefix._4_4_);
            printf(" %d",(ulong)memory._4_4_);
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlBuildQName(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    const xmlChar * ncname; /* the Name */
    int n_ncname;
    const xmlChar * prefix; /* the prefix */
    int n_prefix;
    xmlChar * memory; /* preallocated memory */
    int n_memory;
    int len; /* preallocated memory length */
    int n_len;

    for (n_ncname = 0;n_ncname < gen_nb_const_xmlChar_ptr;n_ncname++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
    for (n_memory = 0;n_memory < gen_nb_xmlChar_ptr;n_memory++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        ncname = gen_const_xmlChar_ptr(n_ncname, 0);
        prefix = gen_const_xmlChar_ptr(n_prefix, 1);
        memory = gen_xmlChar_ptr(n_memory, 2);
        len = gen_int(n_len, 3);
        if ((prefix != NULL) &&
            (len > xmlStrlen(BAD_CAST prefix)))
            len = 0;

        ret_val = xmlBuildQName(ncname, prefix, memory, len);
        if ((ret_val != NULL) && (ret_val != ncname) &&
              (ret_val != prefix) && (ret_val != memory))
              xmlFree(ret_val);
	  ret_val = NULL;
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_ncname, ncname, 0);
        des_const_xmlChar_ptr(n_prefix, prefix, 1);
        des_xmlChar_ptr(n_memory, memory, 2);
        des_int(n_len, len, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlBuildQName",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ncname);
            printf(" %d", n_prefix);
            printf(" %d", n_memory);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}